

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

void __thiscall chrono::ChStreamOutAscii::Format(ChStreamOutAscii *this,char *formatString,...)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  char *__s;
  char in_AL;
  double *pdVar4;
  size_t sVar5;
  ChException *this_00;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argList;
  char local_12a [2];
  undefined8 local_128;
  double *local_120;
  undefined1 *local_118;
  string local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (formatString == (char *)0x0) {
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Bad format string","");
    ChException::ChException(this_00,&local_108);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  local_118 = local_e8;
  local_120 = (double *)&stack0x00000008;
  local_128 = 0x3000000010;
  do {
    cVar2 = *formatString;
    if (cVar2 == '%') {
      pcVar1 = formatString + 1;
      bVar3 = formatString[1];
      if (bVar3 < 0x73) {
        if (bVar3 == 100) {
          uVar6 = local_128 & 0xffffffff;
          if (uVar6 < 0x29) {
            local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
            pdVar4 = (double *)(local_118 + uVar6);
          }
          else {
            pdVar4 = local_120;
            local_120 = local_120 + 1;
          }
          operator<<(this,*(int *)pdVar4);
          formatString = pcVar1;
        }
        else {
          if (bVar3 != 0x66) goto LAB_004ef700;
          uVar6 = (ulong)local_128._4_4_;
          if (uVar6 < 0xa1) {
            local_128 = CONCAT44(local_128._4_4_ + 0x10,(int)local_128);
            pdVar4 = (double *)(local_118 + uVar6);
          }
          else {
            pdVar4 = local_120;
            local_120 = local_120 + 1;
          }
          operator<<(this,*pdVar4);
          formatString = pcVar1;
        }
      }
      else if (bVar3 == 0x75) {
        uVar6 = local_128 & 0xffffffff;
        if (uVar6 < 0x29) {
          local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
          pdVar4 = (double *)(local_118 + uVar6);
        }
        else {
          pdVar4 = local_120;
          local_120 = local_120 + 1;
        }
        operator<<(this,*(uint *)pdVar4);
        formatString = pcVar1;
      }
      else {
        if (bVar3 != 0x73) goto LAB_004ef700;
        uVar6 = local_128 & 0xffffffff;
        if (uVar6 < 0x29) {
          local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
          pdVar4 = (double *)(local_118 + uVar6);
        }
        else {
          pdVar4 = local_120;
          local_120 = local_120 + 1;
        }
        __s = (char *)*pdVar4;
        if (__s != (char *)0x0) {
          sVar5 = strlen(__s);
          (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,__s,sVar5);
          formatString = pcVar1;
        }
      }
    }
    else {
      if (cVar2 == '\0') {
        return;
      }
LAB_004ef700:
      local_12a[1] = 0;
      local_12a[0] = cVar2;
      (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,local_12a,1);
    }
    formatString = formatString + 1;
  } while( true );
}

Assistant:

void ChStreamOutAscii::Format(char* formatString, ...) {
    if (formatString == NULL) {
        throw(ChException("Bad format string"));
    }

    va_list argList;

    // Set va_list to the beginning of optional arguments

    va_start(argList, formatString);
    char* ptr = formatString;

    while (*ptr != '\0') {
        char* str = NULL;
        int nInteger = 0;
        unsigned int unInt = 0;
        double dDoub = 0;

        if (*ptr == '%') {
            switch (*(ptr + 1)) {
                case 's':
                    str = va_arg(argList, char*);

                    if (NULL == str)
                        break;
                    *this << str;
                    ptr++;
                    break;

                case 'd':
                    nInteger = va_arg(argList, int);
                    *this << nInteger;
                    ptr++;
                    break;

                case 'u':
                    unInt = va_arg(argList, unsigned int);
                    *this << unInt;
                    ptr++;
                    break;

                case 'f':
                    dDoub = va_arg(argList, double);
                    *this << dDoub;
                    ptr++;
                    break;
                default:
                    *this << *ptr;
            }
        } else {
            *this << *ptr;
        }

        ptr++;
    }
}